

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O0

void sfts_write_image(sfts_t *f,void *pix,size_t w,size_t h,int t)

{
  int iVar1;
  long nelem;
  int *status;
  undefined8 uVar2;
  ulong in_RCX;
  fitsfile *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  char *_base;
  char _msg [31];
  size_t j;
  void *line;
  long pels [2];
  int ls;
  int ft;
  int *s;
  int *in_stack_00000150;
  fitsfile *in_stack_00000158;
  undefined8 in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff68;
  undefined1 local_78 [30];
  undefined1 local_5a;
  ulong local_58;
  void *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffd8;
  
  nelem = in_RDI + 0x20;
  local_48 = 1;
  uStack_44 = 0;
  if (in_R8D == 2) {
    uVar3 = 0x14;
    iVar1 = (int)((long)in_RDX << 1);
  }
  else if (in_R8D == 4) {
    uVar3 = 0x1e;
    iVar1 = (int)((long)in_RDX << 2);
  }
  else if (in_R8D == 0x20) {
    uVar3 = 0x15;
    iVar1 = (int)((long)in_RDX << 1);
  }
  else if (in_R8D == 0x40) {
    uVar3 = 0x1f;
    iVar1 = (int)((long)in_RDX << 2);
  }
  else if (in_R8D == 0x100) {
    uVar3 = 0x2a;
    iVar1 = (int)((long)in_RDX << 2);
  }
  else {
    if (in_R8D != 0x200) {
      _p2sc_msg("sfts_write_image",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
                ,0x18b,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,
                "FITS: data type not implemented: %d",
                CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),in_R8D));
      exit(1);
    }
    uVar3 = 0x52;
    iVar1 = (int)((long)in_RDX << 3);
  }
  local_50 = (void *)g_malloc((long)iVar1);
  for (local_58 = 0; local_58 < in_RCX; local_58 = local_58 + 1) {
    status = (int *)(local_58 + 1);
    memcpy(local_50,(void *)(in_RSI + ((in_RCX - 1) - local_58) * (long)iVar1),(long)iVar1);
    ffppx(in_RDX,(int)(in_RCX >> 0x20),(long *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),nelem,
          (void *)CONCAT44(uVar3,iVar1),status);
  }
  g_free(local_50);
  ffpcks(in_stack_00000158,in_stack_00000150);
  if ((in_RDI != 0) && (*(int *)(in_RDI + 0x20) != 0)) {
    if (*(long *)(in_RDI + 0x10) == 0) {
      uVar2 = g_strdup("memory");
    }
    else {
      uVar2 = g_path_get_basename(*(undefined8 *)(in_RDI + 0x10));
    }
    ffgerr((int)((ulong)uVar2 >> 0x20),in_stack_ffffffffffffff68);
    local_5a = 0;
    _p2sc_msg("sfts_write_image",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
              ,0x198,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,"FITS: %s: %s",
              local_78,uVar2);
    exit(1);
  }
  return;
}

Assistant:

void sfts_write_image(sfts_t *f, const void *pix, size_t w, size_t h, int t) {
    int *s = &f->stat, ft, ls;
    long pels[] = { 1, 1 };

    switch (t) {
    case SUINT16:
        ft = TUSHORT;
        ls = w * sizeof(guint16);
        break;
    case SUINT32:
        ft = TUINT;
        ls = w * sizeof(guint32);
        break;
    case SINT16:
        ft = TSHORT;
        ls = w * sizeof(gint16);
        break;
    case SINT32:
        ft = TINT;
        ls = w * sizeof(gint32);
        break;
    case SFLOAT:
        ft = TFLOAT;
        ls = w * sizeof(float);
        break;
    case SDOUBLE:
        ft = TDOUBLE;
        ls = w * sizeof(double);
        break;
    default:
        P2SC_Msg(LVL_FATAL_FITS, "FITS: data type not implemented: %d", t);
        return;
    }

    void *line = g_malloc(ls);
    for (size_t j = 0; j < h; ++j) {
        pels[1] = j + 1;
        memcpy(line, (const guint8 *) pix + (h - 1 - j) * ls, ls);
        fits_write_pix(f->fts, ft, pels, w, line, s);
    }
    g_free(line);

    fits_write_chksum(f->fts, s);
    CHK_FTS(f);
}